

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void Diffusion::setBeta(MLEBABecLap *op,MultiFab **beta,int betaComp,int nComp)

{
  array<amrex::MultiFab,_3UL> *in_RDI;
  Array<MultiFab,_3> bcoeffs;
  int in_stack_fffffffffffffb0c;
  int in_stack_fffffffffffffb10;
  MakeType in_stack_fffffffffffffb14;
  MultiFab *in_stack_fffffffffffffb18;
  MultiFab *in_stack_fffffffffffffb20;
  Location in_stack_fffffffffffffb3c;
  Array<const_MultiFab_*,_3> *in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb4c;
  MLEBABecLap *in_stack_fffffffffffffb50;
  
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c);
  amrex::GetArrOfConstPtrs<amrex::MultiFab>
            ((array<amrex::MultiFab,_3UL> *)
             CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  amrex::MLEBABecLap::setBCoeffs
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb3c);
  std::array<amrex::MultiFab,_3UL>::~array(in_RDI);
  return;
}

Assistant:

void
Diffusion::setBeta(MLEBABecLap&           op,
                   const MultiFab* const* beta,
                   int                    betaComp,
                   int                    nComp)
{
    Array<MultiFab,AMREX_SPACEDIM> bcoeffs{
    AMREX_D_DECL(MultiFab(*beta[0], amrex::make_alias, betaComp, nComp),
                 MultiFab(*beta[1], amrex::make_alias, betaComp, nComp),
                 MultiFab(*beta[2], amrex::make_alias, betaComp, nComp) ) };

    op.setBCoeffs(0, amrex::GetArrOfConstPtrs(bcoeffs), MLLinOp::Location::FaceCentroid);
}